

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::AllocateBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                 *this,size_t bytes,BYTE **ppBuffer,ushort pdataCount,ushort xdataSize,
                bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  SIZE_T SVar5;
  size_t resultBytes;
  MEMORY_BASIC_INFORMATION memBasicInfo;
  TEmitBufferAllocation *allocation;
  AutoRealOrFakeCriticalSection<CriticalSection> local_30;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  bool isAnyJittedCode_local;
  bool canAllocInPreReservedHeapPageSegment_local;
  ushort xdataSize_local;
  ushort pdataCount_local;
  BYTE **ppBuffer_local;
  size_t bytes_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  autoCs.cs._2_1_ = isAnyJittedCode;
  autoCs.cs._3_1_ = canAllocInPreReservedHeapPageSegment;
  autoCs.cs._4_2_ = xdataSize;
  autoCs.cs._6_2_ = pdataCount;
  AutoRealOrFakeCriticalSection<CriticalSection>::AutoRealOrFakeCriticalSection
            (&local_30,&this->criticalSection);
  if (ppBuffer == (BYTE **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x161,"(ppBuffer != nullptr)","ppBuffer != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  memBasicInfo._40_8_ =
       NewAllocation(this,bytes,autoCs.cs._6_2_,autoCs.cs._4_2_,(bool)(autoCs.cs._3_1_ & 1),
                     (bool)(autoCs.cs._2_1_ & 1));
  GetBuffer(this,(TEmitBufferAllocation *)memBasicInfo._40_8_,bytes,ppBuffer);
  SVar5 = VirtualQueryEx(this->processHandle,*(LPCVOID *)(*(long *)memBasicInfo._40_8_ + 0x18),
                         (PMEMORY_BASIC_INFORMATION)&resultBytes,0x30);
  if ((SVar5 != 0) && (memBasicInfo.RegionSize._4_4_ != 0x20)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x16a,"(resultBytes == 0 || memBasicInfo.Protect == 0x20)",
                       "resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar2 = memBasicInfo._40_8_;
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_30);
  return (TEmitBufferAllocation *)uVar2;
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc>*
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::AllocateBuffer(__in size_t bytes, __deref_bcount(bytes) BYTE** ppBuffer, ushort pdataCount /*=0*/, ushort xdataSize  /*=0*/, bool canAllocInPreReservedHeapPageSegment /*=false*/,
    bool isAnyJittedCode /* = false*/)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(ppBuffer != nullptr);

    TEmitBufferAllocation * allocation = this->NewAllocation(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode);

    GetBuffer(allocation, bytes, ppBuffer);

#if DBG
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQueryEx(this->processHandle, allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    Assert(resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ);
#endif

    return allocation;
}